

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void vsencoding::__vseblocks_unpack11(uint32_t *out,uint32_t *in,uint32_t bs)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar23 [64];
  
  auVar17 = vpmovsxbd_avx512f(_DAT_00187c40);
  auVar18 = vpmovsxbd_avx512f(_DAT_00187c50);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x3040102));
  auVar9 = vpmovsxwd_avx(ZEXT816(0x7f807f007fe07fc));
  auVar19 = vpbroadcastd_avx512f(ZEXT416(0x7ff));
  auVar7 = vpmovsxbd_avx(ZEXT416(0x807));
  auVar12 = vpmovsxbq_avx2(ZEXT416(0x1000008));
  auVar10 = vpmovsxbd_avx2(ZEXT816(0x404010101000000));
  auVar11 = vpmovsxbd_avx2(ZEXT816(0xd18030e19040f1a));
  auVar8 = vpmovsxbd_avx(ZEXT416(0x10c1702));
  uVar14 = bs + 0x1f >> 5;
  while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
    uVar1 = *(undefined8 *)*(undefined1 (*) [16])((long)in + 0x10);
    auVar3 = *(undefined1 (*) [16])in;
    *out = *(uint *)*(undefined1 (*) [16])in >> 0x15;
    auVar24 = vpshufd_avx(auVar3,0xb1);
    auVar20 = vpermt2d_avx512f(ZEXT1664(auVar3),auVar17,ZEXT1664(CONCAT88(uVar1,uVar1)));
    auVar3 = vpsllvd_avx2(auVar24,auVar6);
    auVar3 = vpand_avx(auVar3,auVar9);
    auVar21 = vshufi64x2_avx512f(ZEXT1664(auVar3),ZEXT1664(auVar3),0);
    auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
    auVar22 = vpbroadcastd_avx512f();
    auVar23._0_52_ = auVar21._0_52_;
    auVar23._52_4_ = auVar22._52_4_;
    auVar23._56_4_ = auVar21._56_4_;
    auVar23._60_4_ = auVar21._60_4_;
    uVar5 = *(ulong *)*(undefined1 (*) [16])((long)in + 0x20);
    auVar21 = vpandd_avx512f(auVar20,auVar19);
    auVar20 = vpord_avx512f(auVar20,auVar23);
    auVar22._4_4_ = auVar20._4_4_;
    auVar22._0_4_ = auVar21._0_4_;
    auVar22._8_4_ = auVar21._8_4_;
    auVar22._12_4_ = auVar21._12_4_;
    auVar22._16_4_ = auVar20._16_4_;
    auVar22._20_4_ = auVar21._20_4_;
    auVar22._24_4_ = auVar21._24_4_;
    auVar22._28_4_ = auVar20._28_4_;
    auVar22._32_4_ = auVar21._32_4_;
    auVar22._36_4_ = auVar21._36_4_;
    auVar22._40_4_ = auVar20._40_4_;
    auVar22._44_4_ = auVar21._44_4_;
    auVar22._48_4_ = auVar21._48_4_;
    auVar22._52_4_ = auVar20._52_4_;
    auVar22._56_4_ = auVar21._56_4_;
    auVar22._60_4_ = auVar21._60_4_;
    uVar2 = *(ulong *)(*(undefined1 (*) [16])((long)in + 0x10) + 8);
    auVar20 = vmovdqu64_avx512f(auVar22);
    *(undefined1 (*) [64])(out + 1) = auVar20;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar5;
    auVar3 = vpshufd_avx(auVar26,0x54);
    auVar13 = vpsrlvd_avx2(auVar3,auVar8);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar2;
    auVar3 = vpsllvd_avx2(auVar24,auVar7);
    auVar25._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar24;
    auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
    auVar3 = vpand_avx(auVar3,ZEXT816(0x70000000780));
    auVar25 = vpermd_avx2(auVar10,auVar25);
    auVar16 = vpermt2d_avx512vl(ZEXT1632(auVar3),auVar12,
                                ZEXT432(((uint)((ulong)uVar1 >> 0x20) & 0x1f) << 6));
    auVar25 = vpsrlvd_avx2(auVar25,auVar11);
    auVar16 = vpor_avx2(auVar25,auVar16);
    auVar25 = vpand_avx2(auVar25,auVar19._0_32_);
    auVar25 = vpblendd_avx2(auVar25,auVar16,0x49);
    auVar24 = vpinsrd_avx(auVar19._0_16_,((uint)uVar5 & 3) << 9,1);
    uVar4 = *(uint *)(*(undefined1 (*) [16])((long)in + 0x20) + 8);
    in = (uint32_t *)(*(undefined1 (*) [16])((long)in + 0x20) + 0xc);
    *(undefined1 (*) [32])(out + 0x11) = auVar25;
    auVar3 = vpand_avx(auVar13,auVar19._0_16_);
    auVar24 = vpor_avx(auVar13,auVar24);
    auVar3 = vpblendd_avx2(auVar3,auVar24,2);
    *(undefined1 (*) [16])(out + 0x19) = auVar3;
    out[0x1d] = ((uint)(uVar5 >> 0x20) & 1) << 10 | uVar4 >> 0x16;
    out[0x1e] = uVar4 >> 0xb & 0x7ff;
    out[0x1f] = uVar4 & 0x7ff;
    out = out + 0x20;
  }
  return;
}

Assistant:

void __vseblocks_unpack11(uint32_t *__restrict__ out,
                          const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 11, --bs) {
    out[0] = in[0] >> 21;
    out[1] = (in[0] >> 10) & 0x07ff;
    out[2] = (in[0] << 1) & 0x07ff;
    out[2] |= in[1] >> 31;
    out[3] = (in[1] >> 20) & 0x07ff;
    out[4] = (in[1] >> 9) & 0x07ff;
    out[5] = (in[1] << 2) & 0x07ff;
    out[5] |= in[2] >> 30;
    out[6] = (in[2] >> 19) & 0x07ff;
    out[7] = (in[2] >> 8) & 0x07ff;
    out[8] = (in[2] << 3) & 0x07ff;
    out[8] |= in[3] >> 29;
    out[9] = (in[3] >> 18) & 0x07ff;
    out[10] = (in[3] >> 7) & 0x07ff;
    out[11] = (in[3] << 4) & 0x07ff;
    out[11] |= in[4] >> 28;
    out[12] = (in[4] >> 17) & 0x07ff;
    out[13] = (in[4] >> 6) & 0x07ff;
    out[14] = (in[4] << 5) & 0x07ff;
    out[14] |= in[5] >> 27;
    out[15] = (in[5] >> 16) & 0x07ff;
    out[16] = (in[5] >> 5) & 0x07ff;
    out[17] = (in[5] << 6) & 0x07ff;
    out[17] |= in[6] >> 26;
    out[18] = (in[6] >> 15) & 0x07ff;
    out[19] = (in[6] >> 4) & 0x07ff;
    out[20] = (in[6] << 7) & 0x07ff;
    out[20] |= in[7] >> 25;
    out[21] = (in[7] >> 14) & 0x07ff;
    out[22] = (in[7] >> 3) & 0x07ff;
    out[23] = (in[7] << 8) & 0x07ff;
    out[23] |= in[8] >> 24;
    out[24] = (in[8] >> 13) & 0x07ff;
    out[25] = (in[8] >> 2) & 0x07ff;
    out[26] = (in[8] << 9) & 0x07ff;
    out[26] |= in[9] >> 23;
    out[27] = (in[9] >> 12) & 0x07ff;
    out[28] = (in[9] >> 1) & 0x07ff;
    out[29] = (in[9] << 10) & 0x07ff;
    out[29] |= in[10] >> 22;
    out[30] = (in[10] >> 11) & 0x07ff;
    out[31] = in[10] & 0x07ff;
  }
}